

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::cmake(cmake *this,Role role,Mode mode,ProjectKind projectKind)

{
  _Rb_tree_header *p_Var1;
  anon_class_1_0_00000001 *this_00;
  size_type sVar2;
  undefined8 *puVar3;
  FileExtensions *pFVar4;
  byte bVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> extList;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> extList_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> extList_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> extList_02;
  Mode mode_local;
  unique_ptr<cmVariableWatch,_std::default_delete<cmVariableWatch>_> *local_168;
  unique_ptr<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_> *local_160;
  ProjectKind projectKind_local;
  anon_class_1_0_00000001 *local_150;
  anon_class_1_0_00000001 *local_148;
  anon_class_1_0_00000001 *local_140;
  anon_class_1_0_00000001 *local_138;
  anon_class_1_0_00000001 *local_130;
  anon_class_1_0_00000001 *local_128;
  cmGeneratedFileStream *local_120;
  string *local_108;
  FileExtensions local_100 [2];
  
  bVar5 = 0;
  (this->DiagLevels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DiagLevels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->DiagLevels)._M_t._M_impl.super__Rb_tree_header;
  (this->Generators).
  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Generators).
  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Generators).
  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ExtraGenerators).
  super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ExtraGenerators).
  super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ExtraGenerators).
  super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->DiagLevels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->DiagLevels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->DiagLevels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->GeneratorInstance)._M_dataplus._M_p = (pointer)&(this->GeneratorInstance).field_2;
  (this->GeneratorInstance)._M_string_length = 0;
  (this->GeneratorInstance).field_2._M_local_buf[0] = '\0';
  (this->GeneratorPlatform)._M_dataplus._M_p = (pointer)&(this->GeneratorPlatform).field_2;
  (this->GeneratorPlatform)._M_string_length = 0;
  (this->GeneratorPlatform).field_2._M_local_buf[0] = '\0';
  (this->GeneratorToolset)._M_dataplus._M_p = (pointer)&(this->GeneratorToolset).field_2;
  (this->GeneratorToolset)._M_string_length = 0;
  (this->GeneratorToolset).field_2._M_local_buf[0] = '\0';
  this->GeneratorInstanceSet = false;
  this->GeneratorPlatformSet = false;
  this->GeneratorToolsetSet = false;
  mode_local = mode;
  projectKind_local = projectKind;
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  this->CurrentWorkingMode = NORMAL_MODE;
  this->DebugOutput = false;
  this->DebugFindOutput = false;
  this->Trace = false;
  this->TraceExpand = false;
  (this->ProgressCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->ProgressCallback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->ProgressCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->ProgressCallback).super__Function_base._M_functor + 8) = 0;
  this->TraceFormatVar = TRACE_HUMAN;
  local_120 = &this->TraceFile;
  local_108 = &this->CMakeWorkingDirectory;
  cmGeneratedFileStream::cmGeneratedFileStream(local_120,None);
  this->TraceRedirect = (cmake *)0x0;
  this->WarnUninitialized = false;
  this->WarnUnusedCli = true;
  this->CheckSystemVars = false;
  this->IgnoreWarningAsError = false;
  (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header;
  (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->CMakeEditCommand)._M_dataplus._M_p = (pointer)&(this->CMakeEditCommand).field_2;
  (this->CMakeEditCommand)._M_string_length = 0;
  (this->CMakeEditCommand).field_2._M_local_buf[0] = '\0';
  (this->CXXEnvironment)._M_dataplus._M_p = (pointer)&(this->CXXEnvironment).field_2;
  (this->CXXEnvironment)._M_string_length = 0;
  (this->CXXEnvironment).field_2._M_local_buf[0] = '\0';
  (this->CCEnvironment)._M_dataplus._M_p = (pointer)&(this->CCEnvironment).field_2;
  (this->CCEnvironment)._M_string_length = 0;
  (this->CCEnvironment).field_2._M_local_buf[0] = '\0';
  (this->CheckBuildSystemArgument)._M_dataplus._M_p =
       (pointer)&(this->CheckBuildSystemArgument).field_2;
  (this->CheckBuildSystemArgument)._M_string_length = 0;
  (this->CheckBuildSystemArgument).field_2._M_local_buf[0] = '\0';
  (this->CheckStampFile)._M_dataplus._M_p = (pointer)&(this->CheckStampFile).field_2;
  (this->CheckStampFile)._M_string_length = 0;
  (this->CheckStampFile).field_2._M_local_buf[0] = '\0';
  (this->CheckStampList)._M_dataplus._M_p = (pointer)&(this->CheckStampList).field_2;
  (this->CheckStampList)._M_string_length = 0;
  (this->CheckStampList).field_2._M_local_buf[0] = '\0';
  (this->VSSolutionFile)._M_dataplus._M_p = (pointer)&(this->VSSolutionFile).field_2;
  (this->VSSolutionFile)._M_string_length = 0;
  (this->VSSolutionFile).field_2._M_local_buf[0] = '\0';
  (this->EnvironmentGenerator)._M_dataplus._M_p = (pointer)&(this->EnvironmentGenerator).field_2;
  (this->EnvironmentGenerator)._M_string_length = 0;
  (this->EnvironmentGenerator).field_2._M_local_buf[0] = '\0';
  local_128 = (anon_class_1_0_00000001 *)&this->CLikeSourceFileExtensions;
  (this->CLikeSourceFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CLikeSourceFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CLikeSourceFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CLikeSourceFileExtensions).unordered._M_h._M_buckets =
       &(this->CLikeSourceFileExtensions).unordered._M_h._M_single_bucket;
  (this->CLikeSourceFileExtensions).unordered._M_h._M_bucket_count = 1;
  (this->CLikeSourceFileExtensions).unordered._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->CLikeSourceFileExtensions).unordered._M_h._M_element_count = 0;
  sVar2 = 0x3f800000;
  (this->CLikeSourceFileExtensions).unordered._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_130 = (anon_class_1_0_00000001 *)&this->HeaderFileExtensions;
  (this->CLikeSourceFileExtensions).unordered._M_h._M_rehash_policy._M_next_resize = 0;
  (this->CLikeSourceFileExtensions).unordered._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->HeaderFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->HeaderFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->HeaderFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->HeaderFileExtensions).unordered._M_h._M_buckets =
       &(this->HeaderFileExtensions).unordered._M_h._M_single_bucket;
  (this->HeaderFileExtensions).unordered._M_h._M_bucket_count = 1;
  (this->HeaderFileExtensions).unordered._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->HeaderFileExtensions).unordered._M_h._M_element_count = 0;
  (this->HeaderFileExtensions).unordered._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_140 = (anon_class_1_0_00000001 *)&this->CudaFileExtensions;
  (this->CudaFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->HeaderFileExtensions).unordered._M_h._M_rehash_policy._M_next_resize = 0;
  (this->HeaderFileExtensions).unordered._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->CudaFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CudaFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CudaFileExtensions).unordered._M_h._M_buckets =
       &(this->CudaFileExtensions).unordered._M_h._M_single_bucket;
  (this->CudaFileExtensions).unordered._M_h._M_bucket_count = 1;
  (this->CudaFileExtensions).unordered._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->CudaFileExtensions).unordered._M_h._M_element_count = 0;
  (this->CudaFileExtensions).unordered._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_138 = (anon_class_1_0_00000001 *)&this->ISPCFileExtensions;
  (this->ISPCFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ISPCFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ISPCFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CudaFileExtensions).unordered._M_h._M_rehash_policy._M_next_resize = 0;
  (this->CudaFileExtensions).unordered._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->ISPCFileExtensions).unordered._M_h._M_buckets =
       &(this->ISPCFileExtensions).unordered._M_h._M_single_bucket;
  (this->ISPCFileExtensions).unordered._M_h._M_bucket_count = 1;
  (this->ISPCFileExtensions).unordered._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ISPCFileExtensions).unordered._M_h._M_element_count = 0;
  (this->ISPCFileExtensions).unordered._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_148 = (anon_class_1_0_00000001 *)&this->FortranFileExtensions;
  (this->ISPCFileExtensions).unordered._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ISPCFileExtensions).unordered._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->FortranFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FortranFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FortranFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FortranFileExtensions).unordered._M_h._M_buckets =
       &(this->FortranFileExtensions).unordered._M_h._M_single_bucket;
  (this->FortranFileExtensions).unordered._M_h._M_bucket_count = 1;
  (this->FortranFileExtensions).unordered._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->FortranFileExtensions).unordered._M_h._M_element_count = 0;
  (this->FortranFileExtensions).unordered._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_150 = (anon_class_1_0_00000001 *)&this->HipFileExtensions;
  (this->FortranFileExtensions).unordered._M_h._M_rehash_policy._M_next_resize = 0;
  (this->FortranFileExtensions).unordered._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->HipFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->HipFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->HipFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->HipFileExtensions).unordered._M_h._M_buckets =
       &(this->HipFileExtensions).unordered._M_h._M_single_bucket;
  (this->HipFileExtensions).unordered._M_h._M_bucket_count = 1;
  (this->HipFileExtensions).unordered._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->HipFileExtensions).unordered._M_h._M_element_count = 0;
  (this->HipFileExtensions).unordered._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->HipFileExtensions).unordered._M_h._M_rehash_policy._M_next_resize = 0;
  (this->HipFileExtensions).unordered._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->ClearBuildSystem = false;
  this->DebugTryCompile = false;
  this->FreshCache = false;
  this->RegenerateDuringBuild = false;
  std::make_unique<cmFileTimeCache>();
  (this->GraphVizFile)._M_dataplus._M_p = (pointer)&(this->GraphVizFile).field_2;
  (this->GraphVizFile)._M_string_length = 0;
  (this->GraphVizFile).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->UnprocessedPresetVariables)._M_t._M_impl.super__Rb_tree_header;
  (this->UnprocessedPresetVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UnprocessedPresetVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->UnprocessedPresetVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->UnprocessedPresetVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->UnprocessedPresetVariables)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->UnprocessedPresetEnvironment)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->UnprocessedPresetEnvironment)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->UnprocessedPresetEnvironment)._M_t._M_impl.super__Rb_tree_header;
  (this->UnprocessedPresetEnvironment)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->UnprocessedPresetEnvironment)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->UnprocessedPresetEnvironment)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_160 = &this->FileTimeCache;
  std::make_unique<cmVariableWatch>();
  (this->FileAPI)._M_t.super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>._M_t.
  super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
  super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl = (cmFileAPI *)0x0;
  local_168 = &this->VariableWatch;
  std::make_unique<cmState,cmState::Mode&,cmState::ProjectKind&>((Mode *)&this->State,&mode_local);
  cmStateSnapshot::cmStateSnapshot(&this->CurrentSnapshot,(cmState *)0x0);
  std::make_unique<cmMessenger>();
  (this->TraceOnlyThisSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TraceOnlyThisSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TraceOnlyThisSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->DebugFindPkgs)._M_t._M_impl.super__Rb_tree_header;
  (this->DebugFindPkgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DebugFindPkgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->DebugFindPkgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->DebugFindPkgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->DebugFindPkgs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->DebugFindVars)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DebugFindVars)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->DebugFindVars)._M_t._M_impl.super__Rb_tree_header;
  (this->DebugFindVars)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->DebugFindVars)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->DebugFindVars)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->MessageLogLevel = LOG_STATUS;
  this->LogLevelWasSetViaCLI = false;
  this->LogContext = false;
  std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            (&this->CheckInProgressMessages);
  (this->GlobalGenerator)._M_t.
  super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
  super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
  super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl = (cmGlobalGenerator *)0x0;
  (this->ProfilingOutput)._M_t.
  super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>._M_t
  .super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>.
  super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl =
       (cmMakefileProfilingData *)0x0;
  std::ofstream::close();
  cmState::CreateBaseSnapshot
            ((cmStateSnapshot *)local_100,
             (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  (this->CurrentSnapshot).Position.Position =
       (PositionType)
       local_100[0].ordered.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->CurrentSnapshot).State =
       (cmState *)
       local_100[0].ordered.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->CurrentSnapshot).Position.Tree =
       (cmLinkedTree<cmStateDetail::SnapshotDataType> *)
       local_100[0].ordered.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  AddDefaultGenerators(this);
  AddDefaultExtraGenerators(this);
  if (role - RoleScript < 2) {
    AddScriptingCommands(this);
    if (role == RoleProject) {
      AddProjectCommands(this);
    }
  }
  if ((mode_local == Help) || (mode_local == Project)) {
    LoadEnvironmentPresets(this);
  }
  cmSystemTools::EnableVSConsoleOutput();
  memcpy(local_100,&DAT_00855478,0xd0);
  extList._M_len = sVar2;
  extList._M_array = (iterator)0xd;
  cmake::anon_class_1_0_00000001::operator()(local_128,local_100,extList);
  this_00 = local_138;
  puVar3 = &DAT_00855548;
  pFVar4 = local_100;
  for (sVar2 = 0x10; sVar2 != 0; sVar2 = sVar2 - 1) {
    (pFVar4->ordered).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    pFVar4 = (FileExtensions *)((long)pFVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  cmake::anon_class_1_0_00000001::operator()
            (local_130,local_100,
             (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>)ZEXT816(8));
  local_100[0].ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x2;
  local_100[0].ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x629044;
  extList_00._M_len = sVar2;
  extList_00._M_array = (iterator)&DAT_00000001;
  cmake::anon_class_1_0_00000001::operator()(local_140,local_100,extList_00);
  puVar3 = &DAT_008555c8;
  pFVar4 = local_100;
  for (sVar2 = 0xe; sVar2 != 0; sVar2 = sVar2 - 1) {
    (pFVar4->ordered).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    pFVar4 = (FileExtensions *)((long)pFVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  cmake::anon_class_1_0_00000001::operator()
            (local_148,local_100,
             (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>)ZEXT816(7));
  local_100[0].ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3;
  local_100[0].ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x62906c;
  extList_01._M_len = sVar2;
  extList_01._M_array = (iterator)&DAT_00000001;
  cmake::anon_class_1_0_00000001::operator()(local_150,local_100,extList_01);
  local_100[0].ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x4;
  local_100[0].ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x629070;
  extList_02._M_len = sVar2;
  extList_02._M_array = (iterator)&DAT_00000001;
  cmake::anon_class_1_0_00000001::operator()(this_00,local_100,extList_02);
  return;
}

Assistant:

cmake::cmake(Role role, cmState::Mode mode, cmState::ProjectKind projectKind)
  : CMakeWorkingDirectory(cmSystemTools::GetCurrentWorkingDirectory())
  , FileTimeCache(cm::make_unique<cmFileTimeCache>())
#ifndef CMAKE_BOOTSTRAP
  , VariableWatch(cm::make_unique<cmVariableWatch>())
#endif
  , State(cm::make_unique<cmState>(mode, projectKind))
  , Messenger(cm::make_unique<cmMessenger>())
{
  this->TraceFile.close();
  this->CurrentSnapshot = this->State->CreateBaseSnapshot();

#ifdef __APPLE__
  struct rlimit rlp;
  if (!getrlimit(RLIMIT_STACK, &rlp)) {
    if (rlp.rlim_cur != rlp.rlim_max) {
      rlp.rlim_cur = rlp.rlim_max;
      setrlimit(RLIMIT_STACK, &rlp);
    }
  }
#endif

  this->AddDefaultGenerators();
  this->AddDefaultExtraGenerators();
  if (role == RoleScript || role == RoleProject) {
    this->AddScriptingCommands();
  }
  if (role == RoleProject) {
    this->AddProjectCommands();
  }

  if (mode == cmState::Project || mode == cmState::Help) {
    this->LoadEnvironmentPresets();
  }

  // Make sure we can capture the build tool output.
  cmSystemTools::EnableVSConsoleOutput();

  // Set up a list of source and header extensions.
  // These are used to find files when the extension is not given.
  {
    auto setupExts = [](FileExtensions& exts,
                        std::initializer_list<cm::string_view> extList) {
      // Fill ordered vector
      exts.ordered.reserve(extList.size());
      for (cm::string_view ext : extList) {
        exts.ordered.emplace_back(ext);
      }
      // Fill unordered set
      exts.unordered.insert(exts.ordered.begin(), exts.ordered.end());
    };

    // The "c" extension MUST precede the "C" extension.
    setupExts(this->CLikeSourceFileExtensions,
              { "c", "C", "c++", "cc", "cpp", "cxx", "cu", "mpp", "m", "M",
                "mm", "ixx", "cppm" });
    setupExts(this->HeaderFileExtensions,
              { "h", "hh", "h++", "hm", "hpp", "hxx", "in", "txx" });
    setupExts(this->CudaFileExtensions, { "cu" });
    setupExts(this->FortranFileExtensions,
              { "f", "F", "for", "f77", "f90", "f95", "f03" });
    setupExts(this->HipFileExtensions, { "hip" });
    setupExts(this->ISPCFileExtensions, { "ispc" });
  }
}